

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall
Database::update_iterator
          (Database *this,DatabaseName *name,uint64_t byte_offset,uint64_t file_offset)

{
  string_view_t fmt;
  bool bVar1;
  pointer ppVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  *pmVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  *in_RCX;
  uint64_t in_RDX;
  DatabaseName *in_RSI;
  OnDiskIterator *in_RDI;
  OnDiskIterator *iter;
  iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  *in_stack_ffffffffffffff98;
  key_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  *this_00;
  string *psVar4;
  _Self local_30;
  _Self local_28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  *local_20;
  uint64_t local_18;
  DatabaseName *local_10;
  
  psVar4 = &(in_RDI->name).filename;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  DatabaseName::get_id_abi_cxx11_(in_RSI);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
       ::find(in_stack_ffffffffffffff98,(key_type *)0x135964);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    ::fmt::v6::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_stack_ffffffffffffffa0,
               (char *)in_stack_ffffffffffffff98);
    DatabaseName::get_id_abi_cxx11_(local_10);
    fmt.size_ = (size_t)in_RDI;
    fmt.data_ = (char *)psVar4;
    spdlog::warn<std::__cxx11::string>(fmt,in_stack_ffffffffffffffa0);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>
                           *)0x1359d0);
    this_00 = local_20;
    pmVar3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
              *)OnDiskIterator::get_total_files(&ppVar2->second);
    if (this_00 < pmVar3) {
      OnDiskIterator::update_offset(&ppVar2->second,local_18,(uint64_t)local_20);
      OnDiskIterator::save(in_RDI);
    }
    else {
      OnDiskIterator::drop((OnDiskIterator *)it._M_node);
      __x = &(in_RDI->name).filename;
      DatabaseName::get_id_abi_cxx11_(local_10);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
      ::erase(this_00,__x);
    }
  }
  return;
}

Assistant:

void Database::update_iterator(const DatabaseName &name, uint64_t byte_offset,
                               uint64_t file_offset) {
    auto it = iterators.find(name.get_id());
    if (it == iterators.end()) {
        spdlog::warn("Can't update invalid iterator {}", name.get_id());
        return;
    }
    OnDiskIterator &iter = it->second;
    if (file_offset >= iter.get_total_files()) {
        iter.drop();
        iterators.erase(name.get_id());
    } else {
        iter.update_offset(byte_offset, file_offset);
        iter.save();
    }
}